

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

void __thiscall duckdb::ParquetReader::InitializeSchema(ParquetReader *this,ClientContext *context)

{
  unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
  *this_00;
  ParquetReader *pPVar1;
  _Alloc_hider __p;
  FileMetaData *file_meta_data;
  pointer pPVar2;
  reference element;
  InvalidInputException *pIVar3;
  ulong __n;
  allocator local_111;
  ParquetReader *local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  _Alloc_hider local_c8;
  
  local_110 = this;
  file_meta_data = GetFileMetadata(this);
  pPVar1 = local_110;
  if ((((byte)file_meta_data->__isset & 8) != 0) &&
     (((byte)(file_meta_data->encryption_algorithm).__isset & 2) != 0)) {
    pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff38,
               "File \'%s\' is encrypted with AES_GCM_CTR_V1, but only AES_GCM_V1 is supported",
               &local_111);
    ::std::__cxx11::string::string
              ((string *)&local_e8,(string *)&(local_110->super_BaseFileReader).file);
    InvalidInputException::InvalidInputException<std::__cxx11::string>
              (pIVar3,(string *)&stack0xffffffffffffff38,&local_e8);
    __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (1 < (ulong)(((long)(file_meta_data->schema).
                         super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                         .
                         super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(file_meta_data->schema).
                        super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                        .
                        super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x148)) {
    ParseSchema((ParquetReader *)&stack0xffffffffffffff38);
    __p._M_p = local_c8._M_p;
    this_00 = &pPVar1->root_schema;
    local_c8._M_p = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>
    ::reset((__uniq_ptr_impl<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>
             *)this_00,(pointer)__p._M_p);
    ::std::
    unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>::
    ~unique_ptr((unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>
                 *)&stack0xffffffffffffff38);
    __n = 0;
    while( true ) {
      pPVar2 = unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
               ::operator->(this_00);
      if ((ulong)(((long)(pPVar2->children).
                         super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                         .
                         super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pPVar2->children).
                        super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                        .
                        super__Vector_base<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x90) <= __n) break;
      pPVar2 = unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
               ::operator->(this_00);
      element = vector<duckdb::ParquetColumnSchema,_true>::get<true>(&pPVar2->children,__n);
      ParseColumnDefinition
                ((MultiFileColumnDefinition *)&stack0xffffffffffffff38,local_110,file_meta_data,
                 element);
      ::std::
      vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
      ::emplace_back<duckdb::MultiFileColumnDefinition>
                (&(pPVar1->super_BaseFileReader).columns.
                  super_vector<duckdb::MultiFileColumnDefinition,_std::allocator<duckdb::MultiFileColumnDefinition>_>
                 ,(MultiFileColumnDefinition *)&stack0xffffffffffffff38);
      MultiFileColumnDefinition::~MultiFileColumnDefinition
                ((MultiFileColumnDefinition *)&stack0xffffffffffffff38);
      __n = __n + 1;
    }
    return;
  }
  pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff38,
             "Failed to read Parquet file \'%s\': Need at least one non-root column in the file",
             &local_111);
  ::std::__cxx11::string::string
            ((string *)&local_108,(string *)&(local_110->super_BaseFileReader).file);
  InvalidInputException::InvalidInputException<std::__cxx11::string>
            (pIVar3,(string *)&stack0xffffffffffffff38,&local_108);
  __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ParquetReader::InitializeSchema(ClientContext &context) {
	auto file_meta_data = GetFileMetadata();

	if (file_meta_data->__isset.encryption_algorithm) {
		if (file_meta_data->encryption_algorithm.__isset.AES_GCM_CTR_V1) {
			throw InvalidInputException("File '%s' is encrypted with AES_GCM_CTR_V1, but only AES_GCM_V1 is supported",
			                            GetFileName());
		}
	}
	// check if we like this schema
	if (file_meta_data->schema.size() < 2) {
		throw InvalidInputException("Failed to read Parquet file '%s': Need at least one non-root column in the file",
		                            GetFileName());
	}
	root_schema = ParseSchema();
	for (idx_t i = 0; i < root_schema->children.size(); i++) {
		auto &element = root_schema->children[i];
		columns.push_back(ParseColumnDefinition(*file_meta_data, element));
	}
}